

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

void despot::DESPOT::Expand
               (QNode *qnode,ScenarioLowerBound *lb,ScenarioUpperBound *ub,DSPOMDP *model,
               RandomStreams *streams,History *history)

{
  State *pSVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  VNode *this;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_00;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_01;
  ulong uVar5;
  size_type sVar6;
  const_reference ppSVar7;
  undefined4 extraout_var;
  log_ostream *plVar8;
  ostream *poVar9;
  void *pvVar10;
  mapped_type *pmVar11;
  pointer ppVar12;
  VNode *this_02;
  mapped_type *ppVVar13;
  double dVar14;
  VNode *vnode;
  OBS_TYPE obs_1;
  _Self local_e0;
  iterator it;
  double upper_bound;
  double lower_bound;
  State *pSStack_c0;
  bool terminal;
  State *copy;
  value_type local_a8;
  State *particle;
  double dStack_98;
  int i;
  double reward;
  OBS_TYPE obs;
  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  partitions;
  double step_reward;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *children;
  VNode *parent;
  History *history_local;
  RandomStreams *streams_local;
  DSPOMDP *model_local;
  ScenarioUpperBound *ub_local;
  ScenarioLowerBound *lb_local;
  QNode *qnode_local;
  
  this = QNode::parent(qnode);
  iVar3 = VNode::depth(this);
  RandomStreams::position(streams,iVar3);
  this_00 = QNode::children(qnode);
  this_01 = VNode::particles(this);
  partitions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  ::map((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
         *)&obs);
  for (particle._4_4_ = 0; uVar5 = (ulong)particle._4_4_,
      sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this_01),
      uVar5 < sVar6; particle._4_4_ = particle._4_4_ + 1) {
    ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (this_01,(long)particle._4_4_);
    local_a8 = *ppSVar7;
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
      plVar8 = logging::stream(4);
      poVar9 = std::operator<<(&plVar8->super_ostream," Original: ");
      poVar9 = despot::operator<<(poVar9,local_a8);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    iVar3 = (*model->_vptr_DSPOMDP[0x16])(model,local_a8);
    pSStack_c0 = (State *)CONCAT44(extraout_var,iVar3);
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
      plVar8 = logging::stream(4);
      poVar9 = std::operator<<(&plVar8->super_ostream," Before step: ");
      poVar9 = despot::operator<<(poVar9,pSStack_c0);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    pSVar1 = pSStack_c0;
    dVar14 = RandomStreams::Entry(streams,pSStack_c0->scenario_id);
    uVar4 = QNode::edge(qnode);
    uVar4 = (*model->_vptr_DSPOMDP[2])
                      (dVar14,model,pSVar1,(ulong)uVar4,&stack0xffffffffffffff68,&reward);
    partitions._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)(dStack_98 * pSStack_c0->weight +
                 (double)partitions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
      plVar8 = logging::stream(4);
      poVar9 = std::operator<<(&plVar8->super_ostream," After step: ");
      poVar9 = despot::operator<<(poVar9,pSStack_c0);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,dStack_98 * pSStack_c0->weight);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,dStack_98);
      poVar9 = std::operator<<(poVar9," ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,pSStack_c0->weight);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
    if ((uVar4 & 1) == 0) {
      pmVar11 = std::
                map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                ::operator[]((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                              *)&obs,(key_type *)&reward);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                (pmVar11,&stack0xffffffffffffff40);
    }
    else {
      (*model->_vptr_DSPOMDP[0x17])(model,pSStack_c0);
    }
  }
  iVar3 = VNode::depth(this);
  dVar14 = Globals::Discount(iVar3);
  upper_bound = dVar14 * (double)partitions._M_t._M_impl.super__Rb_tree_header._M_node_count +
                -DAT_00278a80;
  it._M_node = (_Base_ptr)upper_bound;
  partitions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)upper_bound;
  local_e0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
       ::begin((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                *)&obs);
  while( true ) {
    obs_1 = (OBS_TYPE)
            std::
            map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
            ::end((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                   *)&obs);
    bVar2 = std::operator!=(&local_e0,(_Self *)&obs_1);
    if (!bVar2) break;
    ppVar12 = std::
              _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>
              ::operator->(&local_e0);
    vnode = (VNode *)ppVar12->first;
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
      plVar8 = logging::stream(4);
      poVar9 = std::operator<<(&plVar8->super_ostream," Creating node for obs ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,(ulong)vnode);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
    this_02 = (VNode *)operator_new(0x98);
    pmVar11 = std::
              map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
              ::operator[]((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                            *)&obs,(key_type *)&vnode);
    iVar3 = VNode::depth(this);
    VNode::VNode(this_02,pmVar11,iVar3 + 1,qnode,(OBS_TYPE)vnode);
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
      plVar8 = logging::stream(4);
      poVar9 = std::operator<<(&plVar8->super_ostream," New node created!");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    ppVVar13 = std::
               map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
               ::operator[](this_00,(key_type *)&vnode);
    *ppVVar13 = this_02;
    iVar3 = QNode::edge(qnode);
    History::Add(history,iVar3,(OBS_TYPE)vnode);
    InitBounds(this_02,lb,ub,streams,history);
    History::RemoveLast(history);
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
      plVar8 = logging::stream(4);
      poVar9 = std::operator<<(&plVar8->super_ostream," New node\'s bounds: (");
      dVar14 = VNode::lower_bound(this_02);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar14);
      poVar9 = std::operator<<(poVar9,", ");
      dVar14 = VNode::upper_bound(this_02);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar14);
      poVar9 = std::operator<<(poVar9,")");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    dVar14 = VNode::lower_bound(this_02);
    upper_bound = upper_bound + dVar14;
    dVar14 = VNode::upper_bound(this_02);
    it._M_node = (_Base_ptr)(dVar14 + it._M_node);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>
    ::operator++(&local_e0,0);
  }
  qnode->step_reward = (double)partitions._M_t._M_impl.super__Rb_tree_header._M_node_count;
  QNode::lower_bound(qnode,upper_bound);
  QNode::upper_bound(qnode,(double)it._M_node);
  qnode->utility_upper_bound = (double)it._M_node + DAT_00278a80;
  qnode->default_value = upper_bound;
  std::
  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  ::~map((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
          *)&obs);
  return;
}

Assistant:

void DESPOT::Expand(QNode* qnode, ScenarioLowerBound* lb,
	ScenarioUpperBound* ub, const DSPOMDP* model,
	RandomStreams& streams,
	History& history) {
	VNode* parent = qnode->parent();
	streams.position(parent->depth());
	map<OBS_TYPE, VNode*>& children = qnode->children();

	const vector<State*>& particles = parent->particles();

	double step_reward = 0;

	// Partition particles by observation
	map<OBS_TYPE, vector<State*> > partitions;
	OBS_TYPE obs;
	double reward;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		logd << " Original: " << *particle << endl;

		State* copy = model->Copy(particle);

		logd << " Before step: " << *copy << endl;

		bool terminal = model->Step(*copy, streams.Entry(copy->scenario_id),
			qnode->edge(), reward, obs);

		step_reward += reward * copy->weight;

		logd << " After step: " << *copy << " " << (reward * copy->weight)
			<< " " << reward << " " << copy->weight << endl;

		if (!terminal) {
			partitions[obs].push_back(copy);
		} else {
			model->Free(copy);
		}
	}
	step_reward = Globals::Discount(parent->depth()) * step_reward
		- Globals::config.pruning_constant;//pruning_constant is used for regularization

	double lower_bound = step_reward;
	double upper_bound = step_reward;

	// Create new belief nodes
	for (map<OBS_TYPE, vector<State*> >::iterator it = partitions.begin();
		it != partitions.end(); it++) {
		OBS_TYPE obs = it->first;
		logd << " Creating node for obs " << obs << endl;
		VNode* vnode = new VNode(partitions[obs], parent->depth() + 1,
			qnode, obs);
		logd << " New node created!" << endl;
		children[obs] = vnode;

		history.Add(qnode->edge(), obs);
		InitBounds(vnode, lb, ub, streams, history);
		history.RemoveLast();
		logd << " New node's bounds: (" << vnode->lower_bound() << ", "
			<< vnode->upper_bound() << ")" << endl;

		lower_bound += vnode->lower_bound();
		upper_bound += vnode->upper_bound();
	}

	qnode->step_reward = step_reward;
	qnode->lower_bound(lower_bound);
	qnode->upper_bound(upper_bound);
	qnode->utility_upper_bound = upper_bound + Globals::config.pruning_constant;

	qnode->default_value = lower_bound; // for debugging
}